

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O1

void __thiscall soplex::SoPlexBase<double>::_storeSolutionReal(SoPlexBase<double> *this,bool verify)

{
  SolBase<double> *this_00;
  VectorBase<double> *this_01;
  VectorBase<double> *this_02;
  VectorBase<double> *this_03;
  double *pdVar1;
  SPxSolverBase<double> *this_04;
  VectorBase<double> *pVVar2;
  bool bVar3;
  Status SVar4;
  SPxStatus SVar5;
  SPxSimplifier<double> *pSVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  double dVar13;
  double extraout_XMM0_Qa;
  
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            (&this->_basisStatusRows,
             (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            (&this->_basisStatusCols,
             (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  this_00 = &this->_solReal;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,
             (long)(this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  this_01 = &(this->_solReal)._slacks;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_01->val,
             (long)(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  this_02 = &(this->_solReal)._dual;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_02->val,
             (long)(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  this_03 = &(this->_solReal)._redCost;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_03->val,
             (long)(this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  SVar4 = this->_status;
  bVar9 = true;
  if (SVar4 != OPTIMAL) {
    SVar5 = (this->_solver).super_SPxBasisBase<double>.thestatus;
    if ((SVar5 == UNBOUNDED) || (SVar5 == PRIMAL)) {
      dVar13 = this->_currentSettings->_realParamValues[2] * 10.0;
      pdVar1 = &(this->_solver).theShift;
      bVar9 = *pdVar1 <= dVar13 && dVar13 != *pdVar1;
    }
    else {
      bVar9 = false;
    }
  }
  bVar3 = this->_isRealLPLoaded;
  bVar11 = bVar3 * '\x02';
  if (SVar4 != UNBOUNDED) {
    bVar11 = 0;
  }
  bVar8 = (this->_solReal).field_0x98 & 0xfc | bVar9 | bVar11;
  (this->_solReal).field_0x98 = bVar8;
  bVar12 = 4;
  if (SVar4 != OPTIMAL) {
    if (((this->_solver).super_SPxBasisBase<double>.thestatus | UNBOUNDED) == INFEASIBLE) {
      dVar13 = this->_currentSettings->_realParamValues[2] * 10.0;
      pdVar1 = &(this->_solver).theShift;
      bVar12 = (*pdVar1 <= dVar13 && dVar13 != *pdVar1) << 2;
    }
    else {
      bVar12 = 0;
    }
  }
  this_04 = &this->_solver;
  bVar10 = 0;
  if (SVar4 == INFEASIBLE) {
    bVar10 = bVar3 << 3;
  }
  (this->_solReal).field_0x98 = bVar10 | bVar12 | bVar8 & 0xf3;
  if (bVar11 != 0) {
    pVVar2 = &(this->_solReal)._primalRay;
    std::vector<double,_std::allocator<double>_>::resize
              (&pVVar2->val,
               (long)(this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
    SPxSolverBase<double>::getPrimalray(this_04,pVVar2);
  }
  if (((this->_solReal).field_0x98 & 8) != 0) {
    pVVar2 = &(this->_solReal)._dualFarkas;
    std::vector<double,_std::allocator<double>_>::resize
              (&pVVar2->val,
               (long)(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
    SPxSolverBase<double>::getDualfarkas(this_04,pVVar2);
  }
  SPxSolverBase<double>::getBasis
            (this_04,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
             (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
  SPxSolverBase<double>::getPrimalSol(this_04,&this_00->_primal);
  SPxSolverBase<double>::getSlacks(this_04,this_01);
  SPxSolverBase<double>::getDualSol(this_04,this_02);
  SPxSolverBase<double>::getRedCostSol(this_04,this_03);
  this->_hasBasis = true;
  (this->_solver).m_nonbasicValue = 0.0;
  (this->_solver).m_nonbasicValueUpToDate = false;
  (*(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this_04);
  (this->_solReal)._objVal = extraout_XMM0_Qa;
  this->_hasSolReal = true;
  if (((this->_solver).super_SPxLPBase<double>._isScaled == true) &&
     (this->_isRealLPLoaded == false)) {
    _unscaleSolutionReal(this,&this_04->super_SPxLPBase<double>,false);
  }
  pSVar6 = this->_simplifier;
  if (pSVar6 == (SPxSimplifier<double> *)0x0) {
    if ((SPxSolverBase<double> *)this->_realLP != this_04) {
      _loadRealLP(this,false);
    }
  }
  else {
    SVar5 = (this->_solver).super_SPxBasisBase<double>.thestatus;
    (*pSVar6->_vptr_SPxSimplifier[6])
              (pSVar6,this_00,this_02,this_01,this_03,(this->_basisStatusRows).data,
               (this->_basisStatusCols).data,(ulong)(this->_status == OPTIMAL));
    iVar7 = (*this->_simplifier->_vptr_SPxSimplifier[9])();
    VectorBase<double>::operator=
              (&this_00->_primal,(VectorBase<double> *)CONCAT44(extraout_var,iVar7));
    iVar7 = (*this->_simplifier->_vptr_SPxSimplifier[0xb])();
    VectorBase<double>::operator=(this_01,(VectorBase<double> *)CONCAT44(extraout_var_00,iVar7));
    iVar7 = (*this->_simplifier->_vptr_SPxSimplifier[10])();
    VectorBase<double>::operator=(this_02,(VectorBase<double> *)CONCAT44(extraout_var_01,iVar7));
    iVar7 = (*this->_simplifier->_vptr_SPxSimplifier[0xc])();
    VectorBase<double>::operator=(this_03,(VectorBase<double> *)CONCAT44(extraout_var_02,iVar7));
    (*this->_simplifier->_vptr_SPxSimplifier[0xf])
              (this->_simplifier,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (ulong)(uint)(this->_basisStatusRows).thesize,
               (ulong)(uint)(this->_basisStatusCols).thesize);
    _loadRealLP(this,false);
    (this->_solver).weightsAreSetup = false;
    if ((this->_solver).m_status == OPTIMAL) {
      (this->_solver).m_status = UNKNOWN;
    }
    if (((this->_solver).super_SPxBasisBase<double>.thestatus != SVar5) &&
       ((this->_solver).super_SPxBasisBase<double>.thestatus = SVar5, SVar5 == NO_PROBLEM)) {
      SPxBasisBase<double>::invalidate(&(this->_solver).super_SPxBasisBase<double>);
    }
    SPxSolverBase<double>::setBasis
              (this_04,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    this->_hasBasis = true;
  }
  if (this->_isRealLPScaled == true) {
    _unscaleSolutionReal(this,this->_realLP,true);
  }
  if (verify) {
    if (this->_status == ABORT_VALUE) {
      _verifyObjLimitReal(this);
      return;
    }
    _verifySolutionReal(this);
    return;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeSolutionReal(bool verify)
{
   // prepare storage for basis (enough to fit the original basis)
   _basisStatusRows.reSize(numRows());
   _basisStatusCols.reSize(numCols());

   // prepare storage for the solution data (only in transformed space due to unscaling), w/o setting it to zero
   _solReal._primal.reDim(_solver.nCols(), false);
   _solReal._slacks.reDim(_solver.nRows(), false);
   _solReal._dual.reDim(_solver.nRows(), false);
   _solReal._redCost.reDim(_solver.nCols(), false);

   // check primal status consistency and query solution status
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL || status() != SPxSolverBase<R>::ERROR);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_RATIOTESTER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_PRICER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_SOLVER);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NOT_INIT);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::SINGULAR);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::NO_PROBLEM);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() != SPxBasisBase<R>::PRIMAL
          || status() != SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() != SPxBasisBase<R>::UNBOUNDED
          || status() == SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() == SPxBasisBase<R>::UNBOUNDED
          || _solver.basis().status() == SPxBasisBase<R>::NO_PROBLEM
          || status() != SPxSolverBase<R>::UNBOUNDED);

   _solReal._isPrimalFeasible = (status() == SPxSolverBase<R>::OPTIMAL
                                 || ((_solver.basis().status() == SPxBasisBase<R>::PRIMAL
                                      || _solver.basis().status() == SPxBasisBase<R>::UNBOUNDED)
                                     && _solver.shift() < 10.0 * realParam(SoPlexBase<R>::EPSILON_ZERO)));

   _solReal._hasPrimalRay = (status() == SPxSolverBase<R>::UNBOUNDED && _isRealLPLoaded);

   // check dual status consistency and query solution status
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::ERROR);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_RATIOTESTER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_PRICER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_SOLVER);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::NOT_INIT);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL || status() != SPxSolverBase<R>::SINGULAR);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::NO_PROBLEM);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::UNBOUNDED);
   assert(_solver.basis().status() != SPxBasisBase<R>::DUAL
          || status() != SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() != SPxBasisBase<R>::INFEASIBLE
          || status() == SPxSolverBase<R>::INFEASIBLE);
   assert(_solver.basis().status() == SPxBasisBase<R>::INFEASIBLE
          || _solver.basis().status() == SPxBasisBase<R>::NO_PROBLEM
          || status() != SPxSolverBase<R>::INFEASIBLE);

   _solReal._isDualFeasible = (status() == SPxSolverBase<R>::OPTIMAL
                               || ((_solver.basis().status() == SPxBasisBase<R>::DUAL
                                    || _solver.basis().status() == SPxBasisBase<R>::INFEASIBLE)
                                   && _solver.shift() < 10.0 * realParam(SoPlexBase<R>::EPSILON_ZERO)));

   _solReal._hasDualFarkas = (status() == SPxSolverBase<R>::INFEASIBLE && _isRealLPLoaded);

   // get infeasibility or unboundedness proof if available
   if(_solReal._hasPrimalRay)
   {
      _solReal._primalRay.reDim(_solver.nCols(), false);
      _solver.getPrimalray(_solReal._primalRay);
   }

   if(_solReal._hasDualFarkas)
   {
      _solReal._dualFarkas.reDim(_solver.nRows(), false);
      _solver.getDualfarkas(_solReal._dualFarkas);
   }

   // get solution data from the solver; independent of solution status
   _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                    _basisStatusRows.size(), _basisStatusCols.size());

   _solver.getPrimalSol(_solReal._primal);
   _solver.getSlacks(_solReal._slacks);
   _solver.getDualSol(_solReal._dual);
   _solver.getRedCostSol(_solReal._redCost);

   _hasBasis = true;

   // get primal and/or dual objective function value depending on status
   _solver.forceRecompNonbasicValue();
   _solReal._objVal = _solver.objValue();

   // infeasible solutions shall also be stored and be accessible
   _hasSolReal = true;

   // unscale vectors
   if(_solver.isScaled() && !_isRealLPLoaded)
      _unscaleSolutionReal(_solver, false);

   // get unsimplified solution data from simplifier
   if(_simplifier)
   {
      assert(!_simplifier->isUnsimplified());
      assert(_simplifier->result() == SPxSimplifier<R>::OKAY);
      assert(_realLP != &_solver);

      typename SPxBasisBase<R>::SPxStatus simplifiedBasisStatus = _solver.getBasisStatus();

      try
      {
         // pass solution data of transformed problem to simplifier
         _simplifier->unsimplify(_solReal._primal, _solReal._dual, _solReal._slacks, _solReal._redCost,
                                 _basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), status() == SPxSolverBase<R>::OPTIMAL);
      }
      catch(const SPxException& E)
      {
         SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() <<
                       "> during unsimplification. Resolving without simplifier and scaler.\n");
         _hasBasis = false;
         _preprocessAndSolveReal(false);
         return;
      }

      // copy unsimplified solution data from simplifier (size and dimension is adapted during copy)
      _solReal._primal  = _simplifier->unsimplifiedPrimal();
      _solReal._slacks  = _simplifier->unsimplifiedSlacks();
      _solReal._dual    = _simplifier->unsimplifiedDual();
      _solReal._redCost = _simplifier->unsimplifiedRedCost();

      // overwrite the transformed basis with the unsimplified one
      _simplifier->getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                            _basisStatusRows.size(), _basisStatusCols.size());

      // load original problem but don't setup a slack basis
      _loadRealLP(false);

      // since we presolved the problem, we should not allow access to the dual norms
      _solver.weightsAreSetup = false;

      assert(_realLP == &_solver);

      // reset basis status
      _solver.setBasisStatus(simplifiedBasisStatus);

      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      // load unsimplified basis into solver
      assert(_basisStatusRows.size() == numRows());
      assert(_basisStatusCols.size() == this->numCols());
      _hasBasis = true;
   }

   // load realLP into the solver again (internal scaling was applied)
   else if(_realLP != &_solver)
   {
      assert(_solver.isScaled());
      _loadRealLP(false);
   }

   // unscale stored solution (removes persistent scaling)
   if(_isRealLPScaled)
      _unscaleSolutionReal(*_realLP, true);

   // check solution for violations and solve again if necessary
   if(verify)
   {
      if(_status == SPxSolverBase<R>::ABORT_VALUE)
         _verifyObjLimitReal();
      else
         _verifySolutionReal();
   }

   assert(_solver.nCols() == this->numCols());
   assert(_solver.nRows() == numRows());
}